

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall DMovePolyTo::Tick(DMovePolyTo *this)

{
  double dVar1;
  bool bVar2;
  FPolyObj *this_00;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  this_00 = PO_GetPolyobj((this->super_DPolyAction).m_PolyObj);
  if (this_00 != (FPolyObj *)0x0) {
    bVar2 = FPolyObj::MovePolyobj(this_00,&this->m_Speedv,false);
    if (bVar2) {
      dVar1 = (this->super_DPolyAction).m_Speed;
      dVar5 = ABS(dVar1);
      dVar4 = (this->super_DPolyAction).m_Dist - dVar5;
      (this->super_DPolyAction).m_Dist = dVar4;
      if (dVar4 <= 0.0) {
        SN_StopSequence(this_00);
        (*(this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject[4])(this);
      }
      else if (dVar4 < dVar5) {
        uVar3 = -(ulong)(dVar1 < 0.0);
        (this->super_DPolyAction).m_Speed = (double)(~uVar3 & (ulong)dVar4 | (ulong)-dVar4 & uVar3);
        dVar1 = (this->m_Target).Y;
        dVar4 = (this_00->StartSpot).pos.Y;
        (this->m_Speedv).X = (this->m_Target).X - (this_00->StartSpot).pos.X;
        (this->m_Speedv).Y = dVar1 - dVar4;
      }
      FPolyObj::UpdateLinks(this_00);
      return;
    }
  }
  return;
}

Assistant:

void DMovePolyTo::Tick ()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);

	if (poly != NULL)
	{
		if (poly->MovePolyobj (m_Speedv))
		{
			double absSpeed = fabs (m_Speed);
			m_Dist -= absSpeed;
			if (m_Dist <= 0)
			{
				SN_StopSequence (poly);
				Destroy ();
			}
			else if (m_Dist < absSpeed)
			{
				m_Speed = m_Dist * (m_Speed < 0 ? -1 : 1);
				m_Speedv = m_Target - poly->StartSpot.pos;
			}
			poly->UpdateLinks();
		}
	}
}